

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scroll_widgets.cpp
# Opt level: O0

void draw_mac_arrow_box(am_rect arrow_rect,bool active,Computed_Colors_Record *color_rec,
                       Am_Drawonable *draw)

{
  am_rect r;
  int iVar1;
  Am_Style local_58;
  Am_Style local_50;
  ulong local_48;
  am_rect aStack_40;
  Am_Drawonable *local_30;
  Am_Drawonable *draw_local;
  Computed_Colors_Record *color_rec_local;
  undefined1 auStack_18 [7];
  bool active_local;
  am_rect arrow_rect_local;
  
  _auStack_18 = arrow_rect._0_8_;
  arrow_rect_local.top = arrow_rect.height;
  iVar1 = arrow_rect_local.top;
  local_30 = draw;
  draw_local = (Am_Drawonable *)color_rec;
  color_rec_local._7_1_ = active;
  arrow_rect_local._0_8_ = arrow_rect._8_8_;
  (*draw->_vptr_Am_Drawonable[0x2c])
            (draw,&Am_Black,&color_rec->data->foreground_style,_auStack_18 & 0xffffffff,
             _auStack_18 >> 0x20,arrow_rect._8_8_ & 0xffffffff,iVar1,0);
  if ((color_rec_local._7_1_ & 1) != 0) {
    Inset_Rect((am_rect *)auStack_18,1);
    local_48 = _auStack_18;
    aStack_40.left = arrow_rect_local.left;
    aStack_40.top = arrow_rect_local.top;
    Am_Style::Am_Style(&local_50,(Am_Style *)(draw_local->_vptr_Am_Drawonable + 6));
    Am_Style::Am_Style(&local_58,(Am_Style *)(draw_local->_vptr_Am_Drawonable + 4));
    r.width = aStack_40.left;
    r.height = aStack_40.top;
    r.left = (undefined4)local_48;
    r.top = local_48._4_4_;
    Am_Draw_Rect_Border(r,&local_50,&local_58,local_30);
    Am_Style::~Am_Style(&local_58);
    Am_Style::~Am_Style(&local_50);
  }
  return;
}

Assistant:

void
draw_mac_arrow_box(am_rect arrow_rect, bool active,
                   const Computed_Colors_Record &color_rec, Am_Drawonable *draw)
{
  draw->Draw_Rectangle(Am_Black, color_rec.data->foreground_style,
                       arrow_rect.left, arrow_rect.top, arrow_rect.width,
                       arrow_rect.height);
  if (active) {
    Inset_Rect(arrow_rect, 1);
    Am_Draw_Rect_Border(arrow_rect, color_rec.data->highlight_style,
                        color_rec.data->background_style, draw);
  }
}